

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O2

void etdc_print(etdc_table *table)

{
  ulong uVar1;
  long lVar2;
  
  fwrite("Printing table",0xe,1,_stderr);
  uVar1 = 0;
  for (; table != (etdc_table *)0x0; table = (etdc_table *)(table->hh).next) {
    printf("symbol %u: freq %d\n",(ulong)table->symbol,(ulong)(uint)table->freq);
    printf("rank: %u code: ",uVar1);
    for (lVar2 = 0; lVar2 < table->size; lVar2 = lVar2 + 1) {
      printf("%u ",(ulong)table->code[lVar2]);
    }
    putchar(10);
    uVar1 = (ulong)((int)uVar1 + 1);
  }
  return;
}

Assistant:

void etdc_print(struct etdc_table *table) {
    struct etdc_table *s;
    int i, j;

    fprintf(stderr, "Printing table");
    for(s=(struct etdc_table*)table, j=0; s != (struct etdc_table*)NULL; s=(struct etdc_table*)s->hh.next, j++) {
        printf("symbol %u: freq %d\n", s->symbol, s->freq);

	printf("rank: %u code: ", j);
	for ( i = 0; i < s->size; i++) {
	  printf("%u ", s->code[i]); 
	}
	printf("\n");
    }
}